

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

boundaries __thiscall
duckdb_fmt::v6::internal::fp::assign_with_boundaries<double>(fp *this,double d)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  boundaries bVar10;
  
  uVar9 = (ulong)d & 0xfffffffffffff;
  this->f = uVar9;
  uVar8 = (ulong)d >> 0x34 & 0x7ff;
  uVar7 = (uint)uVar8;
  if (uVar8 == 0) {
    iVar4 = -0x432;
  }
  else {
    this->f = uVar9 | 0x10000000000000;
    iVar4 = uVar7 - 0x433;
  }
  this->e = iVar4;
  uVar1 = this->f;
  uVar8 = uVar1 * 2 + 1;
  cVar3 = (char)iVar4;
  if ((uVar1 & 0x10000000000000) == 0) {
    lVar2 = 0x3f;
    if ((uVar8 & 0x1fffffffffffff) != 0) {
      for (; (uVar8 & 0x1fffffffffffff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar8 = uVar8 << (~(byte)lVar2 + 0x36 & 0x3f);
    cVar5 = (((byte)lVar2 ^ 0x3f) - cVar3) + -9;
  }
  else {
    cVar5 = '\x01' - cVar3;
  }
  bVar6 = 1 < uVar7 && uVar9 == 0;
  bVar10.lower = (uVar1 << bVar6 + 1) + -1 << (cVar3 + cVar5 + ~bVar6 + 10U & 0x3f);
  bVar10.upper = uVar8 << 10;
  return bVar10;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }